

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparser.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int err;
  
  uVar1 = testNewDocNode();
  uVar2 = testStandaloneWithEncoding();
  uVar3 = testUnsupportedEncoding();
  uVar4 = testNodeGetContent();
  uVar5 = testCFileIO();
  uVar6 = testSwitchDtd();
  uVar7 = testCtxtParseContent();
  uVar8 = testBalancedChunk();
  uVar9 = testHugePush();
  uVar10 = testHugeEncodedChunk();
  uVar11 = testPushCDataEnd();
  uVar12 = testHtmlIds();
  uVar13 = testHtmlPushWithEncoding();
  uVar14 = testReaderEncoding();
  uVar15 = testReaderContent();
  uVar16 = testReader();
  uVar17 = testReaderXIncludeError();
  uVar18 = testWriterClose();
  uVar19 = testBuildRelativeUri();
  uVar20 = testCharEncConvImpl();
  return uVar20 | uVar19 | uVar18 | uVar17 | uVar16 | uVar15 | uVar14 | uVar13 | uVar12 | uVar11 | 
                                                  uVar10 | uVar9 | uVar8 | uVar7 | uVar6 | uVar5 | 
                                                  uVar4 | uVar3 | uVar2 | uVar1;
}

Assistant:

int
main(void) {
    int err = 0;

    err |= testNewDocNode();
    err |= testStandaloneWithEncoding();
    err |= testUnsupportedEncoding();
    err |= testNodeGetContent();
    err |= testCFileIO();
#ifdef LIBXML_VALID_ENABLED
    err |= testSwitchDtd();
#endif
#ifdef LIBXML_OUTPUT_ENABLED
    err |= testCtxtParseContent();
#endif
#ifdef LIBXML_SAX1_ENABLED
    err |= testBalancedChunk();
#endif
#ifdef LIBXML_PUSH_ENABLED
    err |= testHugePush();
    err |= testHugeEncodedChunk();
    err |= testPushCDataEnd();
#endif
#ifdef LIBXML_HTML_ENABLED
    err |= testHtmlIds();
#ifdef LIBXML_PUSH_ENABLED
    err |= testHtmlPushWithEncoding();
#endif
#endif
#ifdef LIBXML_READER_ENABLED
    err |= testReaderEncoding();
    err |= testReaderContent();
    err |= testReader();
#ifdef LIBXML_XINCLUDE_ENABLED
    err |= testReaderXIncludeError();
#endif
#endif
#ifdef LIBXML_WRITER_ENABLED
    err |= testWriterClose();
#endif
    err |= testBuildRelativeUri();
#if defined(_WIN32) || defined(__CYGWIN__)
    err |= testWindowsUri();
#endif
    err |= testCharEncConvImpl();

    return err;
}